

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box_Hierarchy.cpp
# Opt level: O2

void __thiscall
Nova::Box_Hierarchy<float,_3>::Intersection_List
          (Box_Hierarchy<float,_3> *this,TV *X,Array<int> *intersection_list)

{
  Box_Hierarchy<float,_3> *pBVar1;
  bool bVar2;
  int *__x;
  Box_Hierarchy<float,_3> **__x_00;
  size_t i;
  ulong uVar3;
  Array<const_Nova::Box_Hierarchy<float,_3>_*> stack;
  _Vector_base<const_Nova::Box_Hierarchy<float,_3>_*,_std::allocator<const_Nova::Box_Hierarchy<float,_3>_*>_>
  local_58;
  Box_Hierarchy<float,_3> *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = this;
  std::
  vector<const_Nova::Box_Hierarchy<float,_3>_*,_std::allocator<const_Nova::Box_Hierarchy<float,_3>_*>_>
  ::push_back((vector<const_Nova::Box_Hierarchy<float,_3>_*,_std::allocator<const_Nova::Box_Hierarchy<float,_3>_*>_>
               *)&local_58,&local_38);
  while (local_58._M_impl.super__Vector_impl_data._M_start !=
         local_58._M_impl.super__Vector_impl_data._M_finish) {
    pBVar1 = local_58._M_impl.super__Vector_impl_data._M_finish[-1];
    local_58._M_impl.super__Vector_impl_data._M_finish =
         local_58._M_impl.super__Vector_impl_data._M_finish + -1;
    bVar2 = Range<float,_3>::Inside(&(pBVar1->box).super_Range<float,_3>,X);
    if (bVar2) {
      for (uVar3 = 0;
          uVar3 < (ulong)((long)(pBVar1->index)._data.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(pBVar1->index)._data.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
        __x = Array<int>::operator[](&pBVar1->index,(int)uVar3);
        std::vector<int,_std::allocator<int>_>::push_back(&intersection_list->_data,__x);
      }
      for (uVar3 = 0;
          uVar3 < (ulong)((long)(pBVar1->children)._data.
                                super__Vector_base<Nova::Box_Hierarchy<float,_3>_*,_std::allocator<Nova::Box_Hierarchy<float,_3>_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pBVar1->children)._data.
                                super__Vector_base<Nova::Box_Hierarchy<float,_3>_*,_std::allocator<Nova::Box_Hierarchy<float,_3>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1)
      {
        __x_00 = Array<Nova::Box_Hierarchy<float,_3>_*>::operator[](&pBVar1->children,(int)uVar3);
        std::
        vector<const_Nova::Box_Hierarchy<float,_3>_*,_std::allocator<const_Nova::Box_Hierarchy<float,_3>_*>_>
        ::push_back((vector<const_Nova::Box_Hierarchy<float,_3>_*,_std::allocator<const_Nova::Box_Hierarchy<float,_3>_*>_>
                     *)&local_58,__x_00);
      }
    }
  }
  std::
  _Vector_base<const_Nova::Box_Hierarchy<float,_3>_*,_std::allocator<const_Nova::Box_Hierarchy<float,_3>_*>_>
  ::~_Vector_base(&local_58);
  return;
}

Assistant:

void Box_Hierarchy<T,d>::
Intersection_List(const TV& X,Array<int>& intersection_list)
{
    Array<const Box_Hierarchy<T,d>*> stack;
    stack.Append(this);
    while(!stack.Empty()){const Box_Hierarchy<T,d>* node=stack.Back();
        stack.Pop_Back();
        // check if node is a leaf and if there is an intersection
        if(node->box.Inside(X)){
            for(size_t i=0;i<node->index.size();++i) intersection_list.Append(node->index[i]);

            // push children of the node on the stack
            for(size_t i=0;i<node->children.size();++i) stack.Append(node->children[i]);}}
}